

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void send_no_cache_header(mg_connection *conn)

{
  mg_response_header_add
            (conn,"Cache-Control","no-cache, no-store, must-revalidate, private, max-age=0",-1);
  mg_response_header_add(conn,"Expires","0",-1);
  if (conn->protocol_type != 0) {
    return;
  }
  mg_response_header_add(conn,"Pragma","no-cache",-1);
  return;
}

Assistant:

static void
send_no_cache_header(struct mg_connection *conn)
{
	/* Send all current and obsolete cache opt-out directives. */
	mg_response_header_add(conn,
	                       "Cache-Control",
	                       "no-cache, no-store, "
	                       "must-revalidate, private, max-age=0",
	                       -1);
	mg_response_header_add(conn, "Expires", "0", -1);

	if (conn->protocol_type == PROTOCOL_TYPE_HTTP1) {
		/* Obsolete, but still send it for HTTP/1.0 */
		mg_response_header_add(conn, "Pragma", "no-cache", -1);
	}
}